

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcFIFO.h
# Opt level: O3

void __thiscall o3dgc::FIFO<long>::PushBack(FIFO<long> *this,long *value)

{
  unsigned_long uVar1;
  unsigned_long uVar2;
  
  if (this->m_size < this->m_allocated) {
    this->m_buffer[this->m_end] = *value;
    this->m_size = this->m_size + 1;
    uVar1 = this->m_end + 1;
    uVar2 = 0;
    if (uVar1 != this->m_allocated) {
      uVar2 = uVar1;
    }
    this->m_end = uVar2;
    return;
  }
  __assert_fail("m_size < m_allocated",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/Open3DGC/o3dgcFIFO.h"
                ,0x4b,"void o3dgc::FIFO<long>::PushBack(const T &) [T = long]");
}

Assistant:

void                    PushBack(const T & value)
                                {
                                    assert( m_size < m_allocated);
                                    m_buffer[m_end] = value;
                                    ++m_size;
                                    ++m_end;
                                    if (m_end == m_allocated) 
                                    {
                                        m_end = 0;
                                    }
                                }